

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primitive_dictionary.hpp
# Opt level: O1

void __thiscall
duckdb::PrimitiveDictionary<duckdb::float_na_equal,_float,_duckdb::FloatingPointOperator>::Insert
          (undefined4 param_1,
          PrimitiveDictionary<duckdb::float_na_equal,_float,_duckdb::FloatingPointOperator> *this)

{
  idx_t iVar1;
  bool bVar2;
  primitive_dictionary_entry_t *ppVar3;
  undefined4 local_14;
  
  if ((this->full == false) &&
     (local_14 = param_1, ppVar3 = Lookup(this,(float_na_equal *)&local_14),
     ppVar3->index == 0xffffffff)) {
    if ((this->size + 1 <= this->maximum_size) &&
       (bVar2 = AddToTarget<duckdb::float_na_equal,_0>(this,(float_na_equal *)&local_14), bVar2)) {
      *(undefined4 *)ppVar3 = local_14;
      iVar1 = this->size;
      this->size = iVar1 + 1;
      ppVar3->index = (uint32_t)iVar1;
      return;
    }
    this->full = true;
  }
  return;
}

Assistant:

void Insert(SRC value) {
		if (full) {
			return;
		}
		auto &entry = Lookup(value);
		if (entry.IsEmpty()) {
			if (size + 1 > maximum_size || !AddToTarget(value)) {
				full = true;
				return;
			}
			entry.value = value;
			entry.index = size++;
		}
	}